

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O2

void __thiscall NaPNFetcher::set_sum_weights(NaPNFetcher *this,NaReal *pfWeights)

{
  NaReal *pNVar1;
  long lVar2;
  long lVar3;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  lVar3 = (long)this->nOutDim;
  if (lVar3 < 0) {
    if (this->pfSumWeights != (NaReal *)0x0) {
      operator_delete__(this->pfSumWeights);
    }
    this->pfSumWeights = (NaReal *)0x0;
  }
  else {
    pNVar1 = (NaReal *)operator_new__(lVar3 * 8);
    this->pfSumWeights = pNVar1;
    lVar2 = 0;
    if (pfWeights == (NaReal *)0x0) {
      for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
        pNVar1[lVar2] = 1.0;
      }
    }
    else {
      for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
        pNVar1[lVar2] = pfWeights[lVar2];
      }
    }
  }
  return;
}

Assistant:

void
NaPNFetcher::set_sum_weights (const NaReal* pfWeights)
{
  check_tunable();

  if(nOutDim < 0)
    {
      delete[] pfSumWeights;
      pfSumWeights = NULL;
    }
  else
    {
      int	i;
      pfSumWeights = new NaReal[nOutDim];
      if(NULL == pfWeights)
	for(i = 0; i < nOutDim; ++i)
	  pfSumWeights[i] = 1.0;
      else
	for(i = 0; i < nOutDim; ++i)
	  pfSumWeights[i] = pfWeights[i];
    }
}